

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cc
# Opt level: O0

PolygonBody * apollonia::World::NewBox(Float mass,Float width,Float height,Vec2 *position)

{
  initializer_list<apollonia::Vec2> __l;
  PolygonBody *this;
  PolygonBody *body;
  allocator<apollonia::Vec2> local_69;
  Vec2 local_68;
  Vec2 local_60;
  Vec2 local_58;
  Vec2 local_50;
  Vec2 *local_48;
  size_type local_40;
  undefined1 local_38 [8];
  VertexList vertices;
  Vec2 *position_local;
  Float height_local;
  Float width_local;
  Float mass_local;
  
  vertices.super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = position;
  Vec2::Vec2(&local_68,width * 0.5,height * 0.5);
  Vec2::Vec2(&local_60,width * -0.5,height * 0.5);
  Vec2::Vec2(&local_58,width * -0.5,height * -0.5);
  Vec2::Vec2(&local_50,width * 0.5,height * -0.5);
  local_40 = 4;
  local_48 = &local_68;
  std::allocator<apollonia::Vec2>::allocator(&local_69);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>::vector
            ((vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_> *)local_38,__l,&local_69);
  std::allocator<apollonia::Vec2>::~allocator(&local_69);
  this = (PolygonBody *)operator_new(0x70);
  PolygonBody::PolygonBody(this,mass,(VertexList *)local_38);
  Body::set_position((Body *)this,
                     vertices.super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>::~vector
            ((vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_> *)local_38);
  return this;
}

Assistant:

PolygonBody* World::NewBox(Float mass,
    Float width, Float height, const Vec2& position) {
  PolygonBody::VertexList vertices = {
    {width/2, height/2}, {-width/2, height/2},
    {-width/2, -height/2}, {width/2, -height/2}
  };
  auto body = new PolygonBody(mass, vertices);
  body->set_position(position);
  return body;
}